

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

VarStatus __thiscall soplex::SoPlexBase<double>::basisColStatus(SoPlexBase<double> *this,int col)

{
  SPxLPBase<double> *pSVar1;
  ulong uVar2;
  VarStatus VVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar4;
  Real RVar5;
  
  VVar3 = ZERO;
  if (-1 < col) {
    uVar2 = (ulong)(uint)col;
    pSVar1 = this->_realLP;
    if (col < (pSVar1->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
      if (this->_hasBasis == false) {
        if (pSVar1->_isScaled == true) {
          (*pSVar1->lp_scaler->_vptr_SPxScaler[0x16])(pSVar1->lp_scaler,pSVar1,uVar2);
          dVar4 = extraout_XMM0_Qa;
        }
        else {
          dVar4 = (pSVar1->super_LPColSetBase<double>).low.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar2];
        }
        RVar5 = this->_currentSettings->_realParamValues[6];
        VVar3 = ON_LOWER;
        if (dVar4 <= -RVar5) {
          pSVar1 = this->_realLP;
          if (pSVar1->_isScaled == true) {
            (*pSVar1->lp_scaler->_vptr_SPxScaler[0x14])(pSVar1->lp_scaler,pSVar1,uVar2);
            RVar5 = this->_currentSettings->_realParamValues[6];
            dVar4 = extraout_XMM0_Qa_00;
          }
          else {
            dVar4 = (pSVar1->super_LPColSetBase<double>).up.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar2];
          }
          VVar3 = (uint)(RVar5 <= dVar4) * 3;
        }
      }
      else {
        if (this->_isRealLPLoaded == true) {
          VVar3 = SPxSolverBase<double>::basisStatusToVarStatus
                            (&this->_solver,
                             (this->_solver).super_SPxBasisBase<double>.thedesc.colstat.data[uVar2])
          ;
          return VVar3;
        }
        VVar3 = (this->_basisStatusCols).data[uVar2];
      }
    }
  }
  return VVar3;
}

Assistant:

typename SPxSolverBase<R>::VarStatus SoPlexBase<R>::basisColStatus(int col) const
{
   assert(col >= 0);
   assert(col < numCols());

   // if index is out of range, return nonbasic status as for a newly added unbounded column
   if(col < 0 || col >= numCols())
   {
      return SPxSolverBase<R>::ZERO;
   }
   // if no basis is available, return slack basis
   else if(!hasBasis())
   {
      if(lowerReal(col) > -realParam(SoPlexBase<R>::INFTY))
         return SPxSolverBase<R>::ON_LOWER;
      else if(upperReal(col) < realParam(SoPlexBase<R>::INFTY))
         return SPxSolverBase<R>::ON_UPPER;
      else
         return SPxSolverBase<R>::ZERO;
   }
   // if the real LP is loaded, ask solver
   else if(_isRealLPLoaded)
   {
      return _solver.getBasisColStatus(col);
   }
   // if the real LP is not loaded, the basis is stored in the basis arrays of this class
   else
   {
      assert(col < _basisStatusCols.size());
      return _basisStatusCols[col];
   }
}